

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

void Gem_ManRealloc(Gem_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Gem_Obj_t *pGVar4;
  size_t __size;
  int iVar5;
  
  uVar1 = p->nObjsAlloc;
  uVar2 = p->nObjs;
  if (uVar2 != uVar1) {
    __assert_fail("p->nObjs == p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0x75,"void Gem_ManRealloc(Gem_Man_t *)");
  }
  if (uVar2 != 0x7fffffff) {
    uVar3 = (long)(int)uVar1 * 2;
    iVar5 = (int)uVar3;
    if ((int)uVar2 < iVar5) {
      printf("Extending object storage: %d -> %d.\n",(ulong)uVar1,uVar3 & 0xffffffff);
      __size = (long)(int)uVar1 << 4;
      if (p->pObjs == (Gem_Obj_t *)0x0) {
        pGVar4 = (Gem_Obj_t *)malloc(__size);
      }
      else {
        pGVar4 = (Gem_Obj_t *)realloc(p->pObjs,__size);
      }
      p->pObjs = pGVar4;
      memset(pGVar4 + p->nObjsAlloc,0,((long)iVar5 - (long)p->nObjsAlloc) * 8);
      p->nObjsAlloc = iVar5;
      return;
    }
    __assert_fail("p->nObjs < nObjNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0x78,"void Gem_ManRealloc(Gem_Man_t *)");
  }
  puts("Hard limit on the number of nodes (0x7FFFFFFF) is reached. Quitting...");
  exit(1);
}

Assistant:

void Gem_ManRealloc( Gem_Man_t * p )
{
    int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, 0x7FFFFFFF );
    assert( p->nObjs == p->nObjsAlloc );
    if ( p->nObjs == 0x7FFFFFFF )
        printf( "Hard limit on the number of nodes (0x7FFFFFFF) is reached. Quitting...\n" ), exit(1);
    assert( p->nObjs < nObjNew );
    printf("Extending object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
    p->pObjs = ABC_REALLOC( Gem_Obj_t, p->pObjs, nObjNew );
    memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gem_Obj_t) * (nObjNew - p->nObjsAlloc) );
    p->nObjsAlloc = nObjNew;
}